

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackNSISGenerator::CreateComponentGroupDescription_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackNSISGenerator *this,cmCPackComponentGroup *group,
          ostream *macrosOut)

{
  bool bVar1;
  undefined1 *puVar2;
  reference ppcVar3;
  reference ppcVar4;
  string local_1c0;
  cmCPackComponent *local_1a0;
  cmCPackComponent *comp;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *__range1_1;
  cmCPackComponentGroup *local_160;
  cmCPackComponentGroup *g;
  iterator __end1;
  iterator __begin1;
  vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  allocator<char> local_2a;
  undefined1 local_29;
  ostream *local_28;
  ostream *macrosOut_local;
  cmCPackComponentGroup *group_local;
  cmCPackNSISGenerator *this_local;
  string *code;
  
  local_28 = macrosOut;
  macrosOut_local = (ostream *)group;
  group_local = (cmCPackComponentGroup *)this;
  this_local = (cmCPackNSISGenerator *)__return_storage_ptr__;
  bVar1 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::empty
                    (&group->Components);
  if ((bVar1) &&
     (bVar1 = std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::empty
                        ((vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>
                          *)&macrosOut_local->field_0x88), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_29 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SectionGroup ",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    if (((byte)macrosOut_local->field_0x60 >> 1 & 1) != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/e ");
    }
    if ((macrosOut_local->field_0x60 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     "\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &macrosOut_local->field_0x20);
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                     "\" ");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     macrosOut_local);
      std::operator+(&local_e0,&local_100,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&__range1);
    }
    else {
      std::operator+(&local_c0,"\"!",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &macrosOut_local->field_0x20);
      std::operator+(&local_a0,&local_c0,"\" ");
      std::operator+(&local_80,&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     macrosOut_local);
      std::operator+(&local_60,&local_80,"\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    puVar2 = &macrosOut_local->field_0x88;
    __end1 = std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::begin
                       ((vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_> *
                        )puVar2);
    g = (cmCPackComponentGroup *)
        std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>::end
                  ((vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_> *)
                   puVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCPackComponentGroup_**,_std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>_>
                                       *)&g), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmCPackComponentGroup_**,_std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>_>
                ::operator*(&__end1);
      local_160 = *ppcVar3;
      CreateComponentGroupDescription_abi_cxx11_((string *)&__range1_1,this,local_160,local_28);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1_1);
      std::__cxx11::string::~string((string *)&__range1_1);
      __gnu_cxx::
      __normal_iterator<cmCPackComponentGroup_**,_std::vector<cmCPackComponentGroup_*,_std::allocator<cmCPackComponentGroup_*>_>_>
      ::operator++(&__end1);
    }
    puVar2 = &macrosOut_local->field_0x68;
    __end1_1 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                         ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)puVar2)
    ;
    comp = (cmCPackComponent *)
           std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                     ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)puVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                               *)&comp), bVar1) {
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
                ::operator*(&__end1_1);
      local_1a0 = *ppcVar4;
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&local_1a0->Files);
      if (!bVar1) {
        CreateComponentDescription_abi_cxx11_(&local_1c0,this,local_1a0,local_28);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      __gnu_cxx::
      __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
      ::operator++(&__end1_1);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"SectionGroupEnd\n");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackNSISGenerator::CreateComponentGroupDescription(
  cmCPackComponentGroup* group, std::ostream& macrosOut)
{
  if (group->Components.empty() && group->Subgroups.empty()) {
    // Silently skip empty groups. NSIS doesn't support them.
    return std::string();
  }

  std::string code = "SectionGroup ";
  if (group->IsExpandedByDefault) {
    code += "/e ";
  }
  if (group->IsBold) {
    code += "\"!" + group->DisplayName + "\" " + group->Name + "\n";
  } else {
    code += "\"" + group->DisplayName + "\" " + group->Name + "\n";
  }

  for (cmCPackComponentGroup* g : group->Subgroups) {
    code += this->CreateComponentGroupDescription(g, macrosOut);
  }

  for (cmCPackComponent* comp : group->Components) {
    if (comp->Files.empty()) {
      continue;
    }

    code += this->CreateComponentDescription(comp, macrosOut);
  }
  code += "SectionGroupEnd\n";
  return code;
}